

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d144c::BuildSystemFrontendImpl::resetAfterBuild(BuildSystemFrontendImpl *this)

{
  std::mutex::lock(&this->stateMutex);
  this->cancelled = false;
  pthread_mutex_unlock((pthread_mutex_t *)&this->stateMutex);
  return;
}

Assistant:

void resetAfterBuild() {
    std::lock_guard<std::mutex> lock(stateMutex);
    cancelled = false;
  }